

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

void Cnf_AddCardinConstrTest(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vVars;
  int *piVar5;
  sat_solver *s;
  long lVar6;
  uint uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  long lVar10;
  
  vVars = (Vec_Int_t *)malloc(0x10);
  vVars->nCap = 0x10;
  piVar5 = (int *)malloc(0x40);
  vVars->pArray = piVar5;
  vVars->nSize = 6;
  auVar1 = _DAT_007ee2e0;
  lVar6 = 0;
  auVar9 = _DAT_007ee2d0;
  do {
    if (SUB164(auVar9 ^ auVar1,4) == -0x80000000 && SUB164(auVar9 ^ auVar1,0) < -0x7ffffffa) {
      piVar5[lVar6] = (int)lVar6;
      piVar5[lVar6 + 1] = (int)lVar6 + 1;
    }
    lVar6 = lVar6 + 2;
    lVar10 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar10 + 2;
  } while (lVar6 != 6);
  s = sat_solver_new();
  sat_solver_setnvars(s,6);
  Cnf_AddCardinConstr(s,vVars);
  uVar7 = 1;
  do {
    iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar2 != 1) break;
    vVars->nSize = 0;
    iVar8 = 0;
    printf("%3d : ",(ulong)uVar7);
    iVar2 = 0;
    do {
      iVar3 = sat_solver_var_value(s,iVar2);
      Vec_IntPush(vVars,iVar3 + iVar8);
      uVar4 = sat_solver_var_value(s,iVar2);
      printf("%d",(ulong)uVar4);
      iVar2 = iVar2 + 1;
      iVar8 = iVar8 + 2;
    } while (iVar2 != 6);
    uVar7 = uVar7 + 1;
    putchar(10);
    iVar2 = sat_solver_addclause(s,vVars->pArray,vVars->pArray + vVars->nSize);
  } while (iVar2 != 0);
  sat_solver_delete(s);
  if (vVars->pArray != (int *)0x0) {
    free(vVars->pArray);
  }
  free(vVars);
  return;
}

Assistant:

void Cnf_AddCardinConstrTest()
{
    int i, status, Count = 1, nVars = 6;
    Vec_Int_t * vVars = Vec_IntStartNatural( nVars );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars );
    Cnf_AddCardinConstr( pSat, vVars );
    //Cnf_AddCardinConstrGeneral( pSat, vVars, 1, 1 );
    while ( 1 )
    {
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( status != l_True )
            break;
        Vec_IntClear( vVars );
        printf( "%3d : ", Count++ );
        for ( i = 0; i < nVars; i++ )
        {
            Vec_IntPush( vVars, Abc_Var2Lit(i, sat_solver_var_value(pSat, i)) );
            printf( "%d", sat_solver_var_value(pSat, i) );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vVars), Vec_IntArray(vVars) + Vec_IntSize(vVars) );
        if ( status == 0 )
            break;
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vVars );
}